

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::operator()(Builder *this,IdentifierExpr *node)

{
  BuilderContext *pBVar1;
  NodeID id;
  element_type *peVar2;
  string local_a0 [32];
  shared_ptr<mocker::ir::Reg> local_80;
  shared_ptr<mocker::ir::Addr> local_70 [2];
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  shared_ptr<mocker::ir::Reg> dest;
  IdentifierExpr *node_local;
  Builder *this_local;
  
  pBVar1 = this->ctx;
  dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_49);
  BuilderContext::makeTempLocalReg((BuilderContext *)local_28,(string *)pBVar1);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  pBVar1 = this->ctx;
  id = ast::ASTNode::getID((ASTNode *)
                           dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
            (local_70,(shared_ptr<mocker::ir::Reg> *)local_28);
  BuilderContext::setExprAddr(pBVar1,id,local_70);
  std::shared_ptr<mocker::ir::Addr>::~shared_ptr(local_70);
  pBVar1 = this->ctx;
  peVar2 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[1]._M_use_count);
  std::__cxx11::string::string(local_a0,(string *)&peVar2->val);
  makeReg((Builder *)&local_80,(string *)this);
  BuilderContext::
  emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>>
            (pBVar1,(shared_ptr<mocker::ir::Reg> *)local_28,&local_80);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_80);
  std::__cxx11::string::~string(local_a0);
  BuilderContext::markExprTrivial
            (this->ctx,
             (Expression *)
             dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ;
  BuilderContext::checkLogicalExpr
            (this->ctx,
             (Expression *)
             dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ;
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_28);
  return;
}

Assistant:

void Builder::operator()(const ast::IdentifierExpr &node) const {
  auto dest = ctx.makeTempLocalReg();
  ctx.setExprAddr(node.getID(), dest);
  ctx.emplaceInst<Load>(dest, makeReg(node.identifier->val));
  ctx.markExprTrivial(node);
  ctx.checkLogicalExpr(node);
}